

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.c
# Opt level: O2

uint32_t chck_utf8_codepoint(char *u8)

{
  byte bVar1;
  uint32_t uVar2;
  ulong uVar3;
  uint32_t cp;
  uint32_t state;
  uint32_t local_30 [2];
  
  if (u8 == (char *)0x0) {
    __assert_fail("u8",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/unicode/unicode.c"
                  ,0x87,"uint32_t chck_utf8_codepoint(const char *)");
  }
  bVar1 = chck_utf8_mblen(u8);
  local_30[1] = 0;
  local_30[0] = (uint32_t)*u8;
  uVar3 = 0;
  do {
    if (bVar1 == uVar3) {
      if ((ulong)bVar1 == 0) {
        return 0xfffd;
      }
      return local_30[0];
    }
    uVar2 = chck_utf8_decode(local_30 + 1,local_30,u8[uVar3]);
    uVar3 = uVar3 + 1;
  } while (uVar2 != 1);
  return 0xfffd;
}

Assistant:

uint32_t
chck_utf8_codepoint(const char u8[4])
{
   assert(u8);

   const uint8_t mb = chck_utf8_mblen(u8);
   uint32_t state = CHCK_UTF8_ACCEPT, cp = u8[0];
   for (uint8_t i = 0; i < mb; ++i) {
      if (chck_utf8_decode(&state, &cp, u8[i]) == CHCK_UTF8_REJECT)
         return CHCK_REPLACEMENT_CHAR;
   }

   return (mb > 0 ? cp : CHCK_REPLACEMENT_CHAR);
}